

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

bool __thiscall
testing::internal::FloatingPoint<float>::AlmostEquals
          (FloatingPoint<float> *this,FloatingPoint<float> *rhs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar1 = (this->u_).bits_;
  if (((~uVar1 & 0x7f800000) == 0 && (uVar1 & 0x7fffff) != 0) ||
     (uVar3 = (rhs->u_).bits_, (~uVar3 & 0x7f800000) == 0 && (uVar3 & 0x7fffff) != 0)) {
    bVar4 = false;
  }
  else {
    uVar2 = uVar1 | 0x80000000;
    if ((int)uVar1 < 0) {
      uVar2 = -uVar1;
    }
    uVar1 = uVar3 | 0x80000000;
    if ((int)uVar3 < 0) {
      uVar1 = -uVar3;
    }
    uVar3 = uVar2 - uVar1;
    if (uVar2 < uVar1) {
      uVar3 = -(uVar2 - uVar1);
    }
    bVar4 = uVar3 < 5;
  }
  return bVar4;
}

Assistant:

bool AlmostEquals(const FloatingPoint& rhs) const {
                // The IEEE standard says that any comparison operation involving
                // a NAN must return false.
                if (is_nan() || rhs.is_nan()) return false;

                return DistanceBetweenSignAndMagnitudeNumbers(u_.bits_, rhs.u_.bits_)
                    <= kMaxUlps;
            }